

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase228::run(TestCase228 *this)

{
  int iVar1;
  RefOrVoid<kj::AsyncIoProvider> ioProvider;
  RefOrVoid<kj::AsyncIoStream> stream;
  AsyncIoProvider *pAVar2;
  undefined4 extraout_var;
  Quantity<long,_kj::_::NanosecondLabel> QVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t __n;
  void *__buf;
  void *__buf_00;
  ReaderOptions receiveOptions;
  int local_500;
  bool local_4f9;
  bool _kj_shouldLog_3;
  Fault f_1;
  Promise<void> local_4e0;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> local_4d0;
  int local_498;
  bool local_491;
  undefined8 uStack_490;
  bool _kj_shouldLog_2;
  long local_488;
  Promise<void> local_480;
  Client local_470;
  int local_458;
  bool local_451;
  bool _kj_shouldLog_1;
  Fault f;
  Promise<void> local_438;
  int local_424;
  undefined1 local_420 [4];
  uint maxSpins;
  int local_408;
  bool local_401;
  undefined1 local_400 [7];
  bool _kj_shouldLog;
  undefined1 local_3c0 [8];
  Client handle2;
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  local_390;
  undefined1 local_358 [8];
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> promise;
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  local_308;
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  local_2d0;
  Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> local_298;
  undefined1 local_258 [8];
  Client handle1;
  undefined1 local_230 [8];
  Client client;
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  int iStack_200;
  undefined1 local_1f8 [8];
  TwoPartyVatNetwork network;
  undefined1 local_68 [8];
  PipeThread serverThread;
  int handleCount;
  int callCount;
  AsyncIoContext ioContext;
  TestCase228 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  kj::setupAsyncIo();
  serverThread.pipe.ptr._4_4_ = 0;
  serverThread.pipe.ptr._0_4_ = 0;
  ioProvider = kj::Own<kj::AsyncIoProvider>::operator*
                         ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
  runServer((PipeThread *)local_68,ioProvider,(int *)((long)&serverThread.pipe.ptr + 4),
            (int *)&serverThread.pipe.ptr);
  stream = kj::Own<kj::AsyncIoStream>::operator*((Own<kj::AsyncIoStream> *)&serverThread.thread.ptr)
  ;
  rpcClient.super_RpcSystemBase.impl.ptr = (Impl *)0x0;
  iStack_200 = 0;
  ReaderOptions::ReaderOptions((ReaderOptions *)&rpcClient.super_RpcSystemBase.impl.ptr);
  receiveOptions._8_8_ = 0;
  receiveOptions.traversalLimitInWords = (uint64_t)rpcClient.super_RpcSystemBase.impl.ptr;
  TwoPartyVatNetwork::TwoPartyVatNetwork
            ((TwoPartyVatNetwork *)local_1f8,stream,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&client.field_0x10,
             (VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>
              *)local_1f8);
  __n = 5;
  getPersistentCap((anon_unknown_0 *)&handle1.field_0x10,
                   (RpcSystem<capnp::rpc::twoparty::VatId> *)&client.field_0x10,SERVER,
                   TEST_MORE_STUFF);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_230,(Client *)&handle1.field_0x10);
  Capability::Client::~Client((Client *)&handle1.field_0x10);
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&promise.super_Pipeline._typeless.ops.disposer,(void *)0x0
            );
  capnproto_test::capnp::test::TestMoreStuff::Client::getHandleRequest
            (&local_308,(Client *)local_230,
             (Maybe<capnp::MessageSize> *)&promise.super_Pipeline._typeless.ops.disposer);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  ::send(&local_2d0,(int)&local_308,__buf,__n,iStack_200);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>
              *)&local_298,&local_2d0);
  capnproto_test::capnp::test::TestMoreStuff::GetHandleResults::Reader::getHandle
            ((Client *)local_258,&local_298.super_Reader);
  Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::~Response(&local_298);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *)
             &local_2d0);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  ::~Request(&local_308);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&promise.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)&handle2.field_0x10,(void *)0x0)
  ;
  capnproto_test::capnp::test::TestMoreStuff::Client::getHandleRequest
            (&local_390,(Client *)local_230,(Maybe<capnp::MessageSize> *)&handle2.field_0x10);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
          *)local_358,(int)&local_390,__buf_00,__n,iStack_200);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  ::~Request(&local_390);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)&handle2.field_0x10);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>
              *)local_400,local_358);
  capnproto_test::capnp::test::TestMoreStuff::GetHandleResults::Reader::getHandle
            ((Client *)local_3c0,(Reader *)local_400);
  Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::~Response
            ((Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *)local_400);
  if ((int)serverThread.pipe.ptr != 2) {
    local_401 = kj::_::Debug::shouldLog(ERROR);
    while (local_401 != false) {
      local_408 = 2;
      kj::_::Debug::log<char_const(&)[38],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0xf5,ERROR,"\"failed: expected \" \"(2) == (handleCount)\", 2, handleCount",
                 (char (*) [38])"failed: expected (2) == (handleCount)",&local_408,
                 (int *)&serverThread.pipe.ptr);
      local_401 = false;
    }
  }
  capnproto_test::capnp::test::TestHandle::Client::Client((Client *)local_420,(void *)0x0);
  capnproto_test::capnp::test::TestHandle::Client::operator=
            ((Client *)local_258,(Client *)local_420);
  capnproto_test::capnp::test::TestHandle::Client::~Client((Client *)local_420);
  local_424 = 1000;
  do {
    if ((int)serverThread.pipe.ptr < 2) {
      if ((int)serverThread.pipe.ptr != 1) {
        local_451 = kj::_::Debug::shouldLog(ERROR);
        while (local_451 != false) {
          local_458 = 1;
          kj::_::Debug::log<char_const(&)[38],int,int&>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                     ,0x109,ERROR,"\"failed: expected \" \"(1) == (handleCount)\", 1, handleCount",
                     (char (*) [38])"failed: expected (1) == (handleCount)",&local_458,
                     (int *)&serverThread.pipe.ptr);
          local_451 = false;
        }
      }
      capnproto_test::capnp::test::TestHandle::Client::Client(&local_470,(void *)0x0);
      capnproto_test::capnp::test::TestHandle::Client::operator=((Client *)local_3c0,&local_470);
      capnproto_test::capnp::test::TestHandle::Client::~Client(&local_470);
      pAVar2 = kj::Own<kj::AsyncIoProvider>::operator->
                         ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
      iVar1 = (*pAVar2->_vptr_AsyncIoProvider[5])();
      uStack_490 = 1000000;
      local_488 = (long)kj::operator*<int,_long,_kj::_::NanosecondLabel>
                                  (10,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x10))
                (&local_480,(long *)CONCAT44(extraout_var_00,iVar1),local_488);
      kj::Promise<void>::wait(&local_480,ioContext.provider.ptr);
      kj::Promise<void>::~Promise(&local_480);
      if ((int)serverThread.pipe.ptr != 1) {
        local_491 = kj::_::Debug::shouldLog(ERROR);
        while (local_491 != false) {
          local_498 = 1;
          kj::_::Debug::log<char_const(&)[38],int,int&>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                     ,0x10e,ERROR,"\"failed: expected \" \"(1) == (handleCount)\", 1, handleCount",
                     (char (*) [38])"failed: expected (1) == (handleCount)",&local_498,
                     (int *)&serverThread.pipe.ptr);
          local_491 = false;
        }
      }
      RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::RemotePromise
                (&local_4d0,(void *)0x0);
      RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::operator=
                ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *)
                 local_358,&local_4d0);
      RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::~RemotePromise
                (&local_4d0);
      do {
        if ((int)serverThread.pipe.ptr < 1) {
          if ((int)serverThread.pipe.ptr != 0) {
            local_4f9 = kj::_::Debug::shouldLog(ERROR);
            while (local_4f9 != false) {
              local_500 = 0;
              kj::_::Debug::log<char_const(&)[38],int,int&>
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                         ,0x116,ERROR,
                         "\"failed: expected \" \"(0) == (handleCount)\", 0, handleCount",
                         (char (*) [38])"failed: expected (0) == (handleCount)",&local_500,
                         (int *)&serverThread.pipe.ptr);
              local_4f9 = false;
            }
          }
          capnproto_test::capnp::test::TestHandle::Client::~Client((Client *)local_3c0);
          RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::
          ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
                          *)local_358);
          capnproto_test::capnp::test::TestHandle::Client::~Client((Client *)local_258);
          capnproto_test::capnp::test::TestMoreStuff::Client::~Client((Client *)local_230);
          RpcSystem<capnp::rpc::twoparty::VatId>::~RpcSystem
                    ((RpcSystem<capnp::rpc::twoparty::VatId> *)&client.field_0x10);
          TwoPartyVatNetwork::~TwoPartyVatNetwork((TwoPartyVatNetwork *)local_1f8);
          kj::AsyncIoProvider::PipeThread::~PipeThread((PipeThread *)local_68);
          kj::AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&handleCount);
          return;
        }
        pAVar2 = kj::Own<kj::AsyncIoProvider>::operator->
                           ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
        iVar1 = (*pAVar2->_vptr_AsyncIoProvider[5])();
        f_1.exception = (Exception *)0xf4240;
        QVar3 = kj::operator*<int,_long,_kj::_::NanosecondLabel>
                          (10,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x10))
                  (&local_4e0,(long *)CONCAT44(extraout_var_01,iVar1),QVar3.value);
        kj::Promise<void>::wait(&local_4e0,ioContext.provider.ptr);
        kj::Promise<void>::~Promise(&local_4e0);
        local_424 = local_424 + -1;
      } while (local_424 != 0);
      kj::_::Debug::Fault::Fault
                ((Fault *)&stack0xfffffffffffffb08,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x114,FAILED,"--maxSpins > 0","");
      kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffb08);
    }
    pAVar2 = kj::Own<kj::AsyncIoProvider>::operator->
                       ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
    iVar1 = (*pAVar2->_vptr_AsyncIoProvider[5])();
    f.exception = (Exception *)0xf4240;
    QVar3 = kj::operator*<int,_long,_kj::_::NanosecondLabel>
                      (10,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
              (&local_438,(long *)CONCAT44(extraout_var,iVar1),QVar3.value);
    kj::Promise<void>::wait(&local_438,ioContext.provider.ptr);
    kj::Promise<void>::~Promise(&local_438);
    local_424 = local_424 + -1;
  } while (local_424 != 0);
  kj::_::Debug::Fault::Fault
            ((Fault *)&stack0xfffffffffffffbb0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
             ,0x107,FAILED,"--maxSpins > 0","");
  kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffbb0);
}

Assistant:

TEST(TwoPartyNetwork, Release) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  // Request the particular capability from the server.
  auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
      test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF).castAs<test::TestMoreStuff>();

  auto handle1 = client.getHandleRequest().send().wait(ioContext.waitScope).getHandle();
  auto promise = client.getHandleRequest().send();
  auto handle2 = promise.wait(ioContext.waitScope).getHandle();

  EXPECT_EQ(2, handleCount);

  handle1 = nullptr;

  // There once was a bug where the last outgoing message (and any capabilities attached) would
  // not get cleaned up (until a new message was sent). This appeared to be a bug in Release,
  // becaues if a client received a message and then released a capability from it but then did
  // not make any further calls, then the capability would not be released because the message
  // introducing it remained the last server -> client message (because a "Release" message has
  // no reply). Here we are explicitly trying to catch this bug. This proves tricky, because when
  // we drop a reference on the client side, there's no particular way to wait for the release
  // message to reach the server except to make a subsequent call and wait for the return -- but
  // that would mask the bug. So, we wait spin waiting for handleCount to change.

  uint maxSpins = 1000;

  while (handleCount > 1) {
    ioContext.provider->getTimer().afterDelay(10 * kj::MILLISECONDS).wait(ioContext.waitScope);
    KJ_ASSERT(--maxSpins > 0);
  }
  EXPECT_EQ(1, handleCount);

  handle2 = nullptr;

  ioContext.provider->getTimer().afterDelay(10 * kj::MILLISECONDS).wait(ioContext.waitScope);
  EXPECT_EQ(1, handleCount);

  promise = nullptr;

  while (handleCount > 0) {
    ioContext.provider->getTimer().afterDelay(10 * kj::MILLISECONDS).wait(ioContext.waitScope);
    KJ_ASSERT(--maxSpins > 0);
  }
  EXPECT_EQ(0, handleCount);
}